

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

void nghttp2_http_record_request_method(nghttp2_stream *stream,nghttp2_frame *frame)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  if ((frame->hd).type == '\x01') {
    lVar5 = 0x30;
    lVar3 = 0x28;
  }
  else {
    if ((frame->hd).type != '\x05') {
      return;
    }
    lVar5 = 0x20;
    lVar3 = 0x18;
  }
  lVar5 = *(long *)((long)frame + lVar5);
  if (lVar5 != 0) {
    plVar4 = (long *)(*(long *)((long)frame + lVar3) + 0x18);
    do {
      if (((plVar4[-1] == 7) && (piVar1 = (int *)plVar4[-3], *(char *)((long)piVar1 + 6) == 'd')) &&
         ((short)piVar1[1] == 0x6f68 && *piVar1 == 0x74656d3a)) {
        if (*plVar4 == 4) {
          if (*(int *)plVar4[-2] != 0x44414548) {
            return;
          }
          uVar2 = 0x100;
        }
        else {
          if (*plVar4 != 7) {
            return;
          }
          if (*(int *)(plVar4[-2] + 3) != 0x5443454e || *(int *)plVar4[-2] != 0x4e4e4f43) {
            return;
          }
          uVar2 = 0x80;
        }
        stream->http_flags = stream->http_flags | uVar2;
        return;
      }
      plVar4 = plVar4 + 5;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void nghttp2_http_record_request_method(nghttp2_stream *stream,
                                        nghttp2_frame *frame) {
  const nghttp2_nv *nva;
  size_t nvlen;
  size_t i;

  switch (frame->hd.type) {
  case NGHTTP2_HEADERS:
    nva = frame->headers.nva;
    nvlen = frame->headers.nvlen;
    break;
  case NGHTTP2_PUSH_PROMISE:
    nva = frame->push_promise.nva;
    nvlen = frame->push_promise.nvlen;
    break;
  default:
    return;
  }

  /* TODO we should do this strictly. */
  for (i = 0; i < nvlen; ++i) {
    const nghttp2_nv *nv = &nva[i];
    if (!(nv->namelen == 7 && nv->name[6] == 'd' &&
          memcmp(":metho", nv->name, nv->namelen - 1) == 0)) {
      continue;
    }
    if (lstreq("CONNECT", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_CONNECT;
      return;
    }
    if (lstreq("HEAD", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_HEAD;
      return;
    }
    return;
  }
}